

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError GetSizeParameter(GlobalConfig *global,char *arg,char *which,curl_off_t *value_out)

{
  byte bVar1;
  CURLofft CVar2;
  size_t sVar3;
  char *fmt;
  curl_off_t value;
  char *unit;
  long local_28;
  byte *local_20;
  
  CVar2 = curlx_strtoofft(arg,(char **)&local_20,0,&local_28);
  if (CVar2 != CURL_OFFT_OK) {
    fmt = "invalid number specified for %s\n";
    goto LAB_00112b53;
  }
  if (*local_20 == 0) {
    local_20 = (byte *)0x11d744;
  }
  else {
    sVar3 = strlen((char *)local_20);
    if (1 < sVar3) {
      local_20 = (byte *)0x11d801;
    }
  }
  bVar1 = *local_20;
  if (bVar1 < 0x62) {
    if (bVar1 < 0x4b) {
      if (bVar1 == 0x42) goto LAB_00112c45;
      if (bVar1 == 0x47) goto LAB_00112bc9;
    }
    else {
      if (bVar1 == 0x4b) goto LAB_00112c25;
      if (bVar1 == 0x4d) goto LAB_00112c07;
    }
  }
  else if (bVar1 < 0x6b) {
    if (bVar1 == 0x62) goto LAB_00112c45;
    if (bVar1 == 0x67) {
LAB_00112bc9:
      if (0x1ffffffff < local_28) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_28 = local_28 << 0x1e;
      goto LAB_00112c45;
    }
  }
  else {
    if (bVar1 == 0x6b) {
LAB_00112c25:
      if (0x1fffffffffffff < local_28) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_28 = local_28 << 10;
LAB_00112c45:
      *value_out = local_28;
      return PARAM_OK;
    }
    if (bVar1 == 0x6d) {
LAB_00112c07:
      if (0x7ffffffffff < local_28) {
        return PARAM_NUMBER_TOO_LARGE;
      }
      local_28 = local_28 << 0x14;
      goto LAB_00112c45;
    }
  }
  fmt = "unsupported %s unit. Use G, M, K or B!\n";
LAB_00112b53:
  warnf(global,fmt,which);
  return PARAM_BAD_USE;
}

Assistant:

static ParameterError GetSizeParameter(struct GlobalConfig *global,
                                       const char *arg,
                                       const char *which,
                                       curl_off_t *value_out)
{
  char *unit;
  curl_off_t value;

  if(curlx_strtoofft(arg, &unit, 0, &value)) {
    warnf(global, "invalid number specified for %s\n", which);
    return PARAM_BAD_USE;
  }

  if(!*unit)
    unit = (char *)"b";
  else if(strlen(unit) > 1)
    unit = (char *)"w"; /* unsupported */

  switch(*unit) {
  case 'G':
  case 'g':
    if(value > (CURL_OFF_T_MAX / (1024*1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024*1024;
    break;
  case 'M':
  case 'm':
    if(value > (CURL_OFF_T_MAX / (1024*1024)))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024*1024;
    break;
  case 'K':
  case 'k':
    if(value > (CURL_OFF_T_MAX / 1024))
      return PARAM_NUMBER_TOO_LARGE;
    value *= 1024;
    break;
  case 'b':
  case 'B':
    /* for plain bytes, leave as-is */
    break;
  default:
    warnf(global, "unsupported %s unit. Use G, M, K or B!\n", which);
    return PARAM_BAD_USE;
  }
  *value_out = value;
  return PARAM_OK;
}